

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::RE2Extract(void)

{
  bool bVar1;
  string s;
  StringPiece local_1d0;
  string local_1c0;
  StringPiece local_1a0;
  LogMessageFatal local_190;
  
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  local_1c0._M_string_length = 0;
  local_1c0.field_2._M_local_buf[0] = '\0';
  local_1d0.ptr_ = "boris@kremvax.ru";
  local_1d0.length_ = 0x10;
  RE2::RE2((RE2 *)&local_190,"(.*)@([^.]*)");
  local_1a0.ptr_ = "\\2!\\1";
  local_1a0.length_ = 5;
  bVar1 = RE2::Extract(&local_1d0,(RE2 *)&local_190,&local_1a0,&local_1c0);
  RE2::~RE2((RE2 *)&local_190);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xda);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,
                    "Check failed: RE2::Extract(\"boris@kremvax.ru\", \"(.*)@([^.]*)\", \"\\\\2!\\\\1\", &s)"
                   );
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  bVar1 = std::operator==(&local_1c0,"kremvax!boris");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xdb);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,
                    "Check failed: (s) == (\"kremvax!boris\")");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  local_1d0.ptr_ = "foo";
  local_1d0.length_ = 3;
  RE2::RE2((RE2 *)&local_190,".*");
  local_1a0.ptr_ = "\'\\0\'";
  local_1a0.length_ = 4;
  bVar1 = RE2::Extract(&local_1d0,(RE2 *)&local_190,&local_1a0,&local_1c0);
  RE2::~RE2((RE2 *)&local_190);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xdd);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,
                    "Check failed: RE2::Extract(\"foo\", \".*\", \"\'\\\\0\'\", &s)");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  bVar1 = std::operator==(&local_1c0,"\'foo\'");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xde);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,"Check failed: (s) == (\"\'foo\'\")"
                   );
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  local_1d0.ptr_ = "baz";
  local_1d0.length_ = 3;
  RE2::RE2((RE2 *)&local_190,"bar");
  local_1a0.ptr_ = "\'\\0\'";
  local_1a0.length_ = 4;
  bVar1 = RE2::Extract(&local_1d0,(RE2 *)&local_190,&local_1a0,&local_1c0);
  RE2::~RE2((RE2 *)&local_190);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xe0);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,
                    "Check failed: !RE2::Extract(\"baz\", \"bar\", \"\'\\\\0\'\", &s)");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  bVar1 = std::operator==(&local_1c0,"\'foo\'");
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0xe1);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,"Check failed: (s) == (\"\'foo\'\")"
                   );
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  std::__cxx11::string::~string((string *)&local_1c0);
  return;
}

Assistant:

TEST(CheckRewriteString, all) {
  TestCheckRewriteString("abc", "foo", true);
  TestCheckRewriteString("abc", "foo\\", false);
  TestCheckRewriteString("abc", "foo\\0bar", true);

  TestCheckRewriteString("a(b)c", "foo", true);
  TestCheckRewriteString("a(b)c", "foo\\0bar", true);
  TestCheckRewriteString("a(b)c", "foo\\1bar", true);
  TestCheckRewriteString("a(b)c", "foo\\2bar", false);
  TestCheckRewriteString("a(b)c", "f\\\\2o\\1o", true);

  TestCheckRewriteString("a(b)(c)", "foo\\12", true);
  TestCheckRewriteString("a(b)(c)", "f\\2o\\1o", true);
  TestCheckRewriteString("a(b)(c)", "f\\oo\\1", false);
}